

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void dxil_spv::CFGStructurizer::merge_to_succ(CFGNode *node,uint index)

{
  reference ppCVar1;
  CFGNode *pCStack_10;
  uint index_local;
  CFGNode *node_local;
  
  pCStack_10 = node;
  ppCVar1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            operator[](&node->succ,(ulong)index);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::push_back
            (&(*ppCVar1)->headers,&stack0xfffffffffffffff0);
  ppCVar1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            operator[](&pCStack_10->succ,(ulong)index);
  pCStack_10->selection_merge_block = *ppCVar1;
  pCStack_10->merge = Selection;
  return;
}

Assistant:

void CFGStructurizer::merge_to_succ(CFGNode *node, unsigned index)
{
	node->succ[index]->headers.push_back(node);
	node->selection_merge_block = node->succ[index];
	node->merge = MergeType::Selection;
	//LOGI("Fixup selection merge %s -> %s\n", node->name.c_str(), node->selection_merge_block->name.c_str());
}